

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O1

void tlstran_pipe_send_cb(void *arg)

{
  nni_aio *aio;
  nni_mtx *mtx;
  nng_err result;
  nni_aio *aio_00;
  size_t sVar1;
  nni_msg *m;
  
  aio = (nni_aio *)((long)arg + 0xa0);
  mtx = (nni_mtx *)((long)arg + 0x600);
  nni_mtx_lock(mtx);
  aio_00 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x38));
  result = nni_aio_result(aio);
  if (result != NNG_OK) {
    nni_aio_list_remove(aio_00);
    nni_mtx_unlock(mtx);
    nni_aio_finish_error(aio_00,result);
    nni_pipe_bump_error(*(nni_pipe **)((long)arg + 8),result);
    return;
  }
  sVar1 = nni_aio_count(aio);
  nni_aio_iov_advance(aio,sVar1);
  sVar1 = nni_aio_iov_count(aio);
  if (sVar1 != 0) {
    nng_stream_send(*arg,aio);
    nni_mtx_unlock(mtx);
    return;
  }
  nni_aio_list_remove(aio_00);
  tlstran_pipe_send_start((tlstran_pipe *)arg);
  m = nni_aio_get_msg(aio_00);
  sVar1 = nni_msg_len(m);
  nni_pipe_bump_tx(*(nni_pipe **)((long)arg + 8),sVar1);
  nni_mtx_unlock(mtx);
  nni_aio_set_msg(aio_00,(nni_msg *)0x0);
  nni_msg_free(m);
  nni_aio_finish_sync(aio_00,NNG_OK,sVar1);
  return;
}

Assistant:

static void
tlstran_pipe_send_cb(void *arg)
{
	tlstran_pipe *p = arg;
	int           rv;
	nni_aio      *aio;
	size_t        n;
	nni_msg      *msg;
	nni_aio      *txaio = &p->txaio;

	nni_mtx_lock(&p->mtx);
	aio = nni_list_first(&p->sendq);

	if ((rv = nni_aio_result(txaio)) != 0) {
		// Intentionally we do not queue up another transfer.
		// There's an excellent chance that the pipe is no longer
		// usable, with a partial transfer.
		// The protocol should see this error, and close the
		// pipe itself, we hope.
		nni_aio_list_remove(aio);
		nni_mtx_unlock(&p->mtx);
		nni_aio_finish_error(aio, rv);
		nni_pipe_bump_error(p->npipe, rv);
		return;
	}

	n = nni_aio_count(txaio);
	nni_aio_iov_advance(txaio, n);
	if (nni_aio_iov_count(txaio) > 0) {
		nng_stream_send(p->tls, txaio);
		nni_mtx_unlock(&p->mtx);
		return;
	}
	nni_aio_list_remove(aio);
	tlstran_pipe_send_start(p);

	msg = nni_aio_get_msg(aio);
	n   = nni_msg_len(msg);
	nni_pipe_bump_tx(p->npipe, n);
	nni_mtx_unlock(&p->mtx);
	nni_aio_set_msg(aio, NULL);
	nni_msg_free(msg);
	nni_aio_finish_sync(aio, 0, n);
}